

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O3

void addMiniBatchSize<CoreML::Specification::NeuralNetworkClassifier>
               (NeuralNetworkClassifier *nn,OptimizerTypeCase optimizerType,int64_t defaultValue,
               int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  long lVar1;
  NetworkUpdateParameters *this;
  Optimizer *this_00;
  AdamOptimizer *this_01;
  Int64Parameter *this_02;
  Int64Set *this_03;
  _Base_ptr p_Var2;
  Int64Range *this_04;
  _Rb_tree_header *p_Var3;
  int iVar4;
  int iVar5;
  
  this = nn->updateparams_;
  if (this == (NetworkUpdateParameters *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
    nn->updateparams_ = this;
  }
  this_00 = this->optimizer_;
  if (this_00 == (Optimizer *)0x0) {
    this_00 = (Optimizer *)operator_new(0x20);
    CoreML::Specification::Optimizer::Optimizer(this_00);
    this->optimizer_ = this_00;
  }
  if (optimizerType == kAdamOptimizer) {
    if (this_00->_oneof_case_[0] == 0xb) {
      this_01 = (AdamOptimizer *)(this_00->OptimizerType_).sgdoptimizer_;
    }
    else {
      CoreML::Specification::Optimizer::clear_OptimizerType(this_00);
      this_00->_oneof_case_[0] = 0xb;
      this_01 = (AdamOptimizer *)operator_new(0x40);
      CoreML::Specification::AdamOptimizer::AdamOptimizer(this_01);
      (this_00->OptimizerType_).adamoptimizer_ = this_01;
    }
    this_02 = this_01->minibatchsize_;
    if (this_02 != (Int64Parameter *)0x0) goto LAB_001991ed;
    this_02 = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(this_02);
  }
  else {
    if (optimizerType != kSgdOptimizer) {
      this_02 = (Int64Parameter *)0x0;
      goto LAB_001991ed;
    }
    if (this_00->_oneof_case_[0] == 10) {
      this_01 = (AdamOptimizer *)(this_00->OptimizerType_).sgdoptimizer_;
    }
    else {
      CoreML::Specification::Optimizer::clear_OptimizerType(this_00);
      this_00->_oneof_case_[0] = 10;
      this_01 = (AdamOptimizer *)operator_new(0x30);
      CoreML::Specification::SGDOptimizer::SGDOptimizer((SGDOptimizer *)this_01);
      (this_00->OptimizerType_).sgdoptimizer_ = (SGDOptimizer *)this_01;
    }
    this_02 = this_01->minibatchsize_;
    if (this_02 != (Int64Parameter *)0x0) goto LAB_001991ed;
    this_02 = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(this_02);
  }
  this_01->minibatchsize_ = this_02;
LAB_001991ed:
  this_02->defaultvalue_ = defaultValue;
  if ((allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (this_02->_oneof_case_[0] == 10) {
      this_04 = (this_02->AllowedValues_).range_;
    }
    else {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(this_02);
      this_02->_oneof_case_[0] = 10;
      this_04 = (Int64Range *)operator_new(0x28);
      CoreML::Specification::Int64Range::Int64Range(this_04);
      (this_02->AllowedValues_).range_ = this_04;
    }
    this_04->minvalue_ = minValue;
    this_04->maxvalue_ = maxValue;
  }
  else {
    if (this_02->_oneof_case_[0] == 0xb) {
      this_03 = (this_02->AllowedValues_).set_;
    }
    else {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(this_02);
      this_02->_oneof_case_[0] = 0xb;
      this_03 = (Int64Set *)operator_new(0x28);
      CoreML::Specification::Int64Set::Int64Set(this_03);
      (this_02->AllowedValues_).set_ = this_03;
    }
    p_Var2 = (allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(allowedValues->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      iVar4 = (this_03->values_).current_size_;
      do {
        lVar1 = *(long *)(p_Var2 + 1);
        iVar5 = iVar4;
        if (iVar4 == (this_03->values_).total_size_) {
          google::protobuf::RepeatedField<long>::Reserve(&this_03->values_,iVar4 + 1);
          iVar5 = (this_03->values_).current_size_;
        }
        iVar4 = iVar5 + 1;
        (this_03->values_).current_size_ = iVar4;
        ((this_03->values_).rep_)->elements[iVar5] = lVar1;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
  }
  return;
}

Assistant:

void addMiniBatchSize(NeuralNetworkClass *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    
    Specification::Int64Parameter *miniBatchSize = NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            miniBatchSize = optimizer->mutable_sgdoptimizer()->mutable_minibatchsize();
            break;
        case Specification::Optimizer::kAdamOptimizer:
            miniBatchSize = optimizer->mutable_adamoptimizer()->mutable_minibatchsize();
            break;
        default:
            break;
    }
    
    miniBatchSize->set_defaultvalue(defaultValue);
    
    if (allowedValues.size() == 0) {
        auto int64Range = miniBatchSize->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = miniBatchSize->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}